

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O2

bool __thiscall QHttpHeaders::contains(QHttpHeaders *this,QAnyStringView name)

{
  QHttpHeadersPrivate *pQVar1;
  long lVar2;
  const_iterator __first;
  bool bVar3;
  long in_FS_OFFSET;
  undefined1 local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 == (QHttpHeadersPrivate *)0x0) || (lVar2 = (pQVar1->headers).d.size, lVar2 == 0)) {
    bVar3 = false;
  }
  else {
    __first.i = (pQVar1->headers).d.ptr;
    HeaderName::HeaderName((HeaderName *)local_40,name);
    bVar3 = std::any_of<QList<Header>::const_iterator,headerNameMatches(HeaderName_const&)::__0>
                      (__first,__first.i + lVar2,(HeaderName *)local_40);
    std::__detail::__variant::_Variant_storage<false,_QHttpHeaders::WellKnownHeader,_QByteArray>::
    _M_reset((_Variant_storage<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpHeaders::contains(QAnyStringView name) const
{
    if (isEmpty())
        return false;

    return std::any_of(d->headers.cbegin(), d->headers.cend(), headerNameMatches(HeaderName{name}));
}